

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O3

void __thiscall
dg::SubgraphNode<dg::dda::RWNode>::insertBefore(SubgraphNode<dg::dda::RWNode> *this,RWNode *n)

{
  pointer ppRVar1;
  RWNode *pRVar2;
  pointer ppRVar3;
  pointer ppRVar4;
  pointer ppRVar5;
  uint uVar6;
  ulong uVar7;
  
  ppRVar3 = (this->_predecessors).
            super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  ppRVar1 = (n->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
            super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppRVar4 = (this->_predecessors).
            super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppRVar5 = (this->_predecessors).
            super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (this->_predecessors).super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (n->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
       super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->_predecessors).super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppRVar1;
  (this->_predecessors).super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (n->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
       super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (n->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppRVar4;
  (n->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppRVar5;
  (n->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = ppRVar3;
  addSuccessor(this,n);
  ppRVar3 = (this->_predecessors).
            super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppRVar1 = (this->_predecessors).
            super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppRVar3 != ppRVar1) {
    do {
      pRVar2 = *ppRVar3;
      ppRVar4 = (pRVar2->super_SubgraphNode<dg::dda::RWNode>)._successors.
                super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppRVar5 = (pRVar2->super_SubgraphNode<dg::dda::RWNode>)._successors.
                super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppRVar5 != ppRVar4) {
        uVar6 = 1;
        uVar7 = 0;
        do {
          if (ppRVar4[uVar7] == n) {
            ppRVar4[uVar7] = (RWNode *)&this[-1].size;
            ppRVar4 = (pRVar2->super_SubgraphNode<dg::dda::RWNode>)._successors.
                      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppRVar5 = (pRVar2->super_SubgraphNode<dg::dda::RWNode>)._successors.
                      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar7 = (ulong)uVar6;
          uVar6 = uVar6 + 1;
        } while (uVar7 < (ulong)((long)ppRVar5 - (long)ppRVar4 >> 3));
      }
      ppRVar3 = ppRVar3 + 1;
    } while (ppRVar3 != ppRVar1);
  }
  return;
}

Assistant:

void insertBefore(NodeT *n) {
        assert(n && "Passed nullptr as the node");
        assert(predecessorsNum() == 0);
        assert(successorsNum() == 0);

        // take over predecessors
        _predecessors.swap(n->_predecessors);

        // 'n' is a successors of this node
        addSuccessor(n);

        // replace the reference to n in predecessors
        for (NodeT *pred : _predecessors) {
            for (unsigned i = 0; i < pred->successorsNum(); ++i) {
                if (pred->_successors[i] == n)
                    pred->_successors[i] = static_cast<NodeT *>(this);
            }
        }
    }